

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall LowererMD::LowerRet(LowererMD *this,Instr *retInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  IRType type;
  byte bVar4;
  Which WVar5;
  JITTimeFunctionBody *pJVar6;
  RegOpnd *dst;
  AsmJsJITInfo *this_00;
  Opnd *src;
  undefined4 *puVar7;
  
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
  if ((!bVar2) || (bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem), bVar2)) {
    dst = IR::RegOpnd::New(TyInt64,this->m_func);
    RVar3 = LowererMDArch::GetRegReturn(TyInt64);
  }
  else {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar6);
    WVar5 = AsmJsJITInfo::GetRetType(this_00);
    switch(WVar5) {
    case Int64:
      type = TyInt64;
      break;
    case Double:
      type = TyFloat64;
      break;
    case Float:
      type = TyFloat32;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x3dc,"((0))","UNREACHED");
      if (!bVar2) goto LAB_00650c74;
      *puVar7 = 0;
    case Signed:
      type = TyInt32;
      break;
    case Void:
      goto switchD_00650ab1_caseD_d;
    case Int32x4:
      type = TySimd128I4;
      break;
    case Uint32x4:
      type = TySimd128U4;
      break;
    case Int16x8:
      type = TySimd128I8;
      break;
    case Int8x16:
      type = TySimd128I16;
      break;
    case Uint16x8:
      type = TySimd128U8;
      break;
    case Uint8x16:
      type = TySimd128U16;
      break;
    case Bool32x4:
      type = TySimd128B4;
      break;
    case Bool16x8:
      type = TySimd128B8;
      break;
    case Bool8x16:
      type = TySimd128B16;
      break;
    case Float32x4:
      type = TySimd128F4;
      break;
    case Float64x2:
      type = TySimd128D2;
      break;
    case Int64x2:
      type = TySimd128I2;
    }
    dst = IR::RegOpnd::New(type,this->m_func);
    RVar3 = LowererMDArch::GetRegReturnAsmJs(type);
  }
  dst->m_reg = RVar3;
  src = IR::Instr::UnlinkSrc1(retInstr);
  Lowerer::InsertMove(&dst->super_Opnd,src,retInstr,true);
  if (retInstr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_00650c74;
    *puVar7 = 0;
  }
  func = retInstr->m_func;
  if ((dst->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_00650c74:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  bVar4 = (dst->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    dst = (RegOpnd *)IR::Opnd::Copy(&dst->super_Opnd,func);
    bVar4 = (dst->super_Opnd).field_0xb;
  }
  (dst->super_Opnd).field_0xb = bVar4 | 2;
  retInstr->m_src1 = &dst->super_Opnd;
switchD_00650ab1_caseD_d:
  return retInstr;
}

Assistant:

IR::Instr *
LowererMD::LowerRet(IR::Instr * retInstr)
{
    IR::RegOpnd * retReg = nullptr;
    bool needsRetReg = true;
#ifdef ASMJS_PLAT
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody()) // for loop body ret is the bytecodeoffset
    {
        Js::AsmJsRetType::Which asmType = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetRetType();
        IRType regType = TyInt32;
        switch (asmType)
        {
        case Js::AsmJsRetType::Double:
            regType = TyFloat64;
            break;
        case Js::AsmJsRetType::Float:
            regType = TyFloat32;
            break;
        case Js::AsmJsRetType::Int64:
        {
            regType = TyInt64;
#if LOWER_SPLIT_INT64
            regType = TyInt32;
            {
                IR::Opnd* lowOpnd = nullptr;
                IR::Opnd* highOpnd = nullptr;
                if (retInstr->GetSrc1()->IsRegOpnd())
                {
                    Int64RegPair srcPair = m_func->FindOrCreateInt64Pair(retInstr->GetSrc1()->AsRegOpnd());
                    lowOpnd = srcPair.low;
                    highOpnd = srcPair.high;
                }
                else if (retInstr->GetSrc1()->IsImmediateOpnd())
                {
                    int64 value = retInstr->GetSrc1()->GetImmediateValue(m_func);
                    lowOpnd = IR::IntConstOpnd::New(value & UINT_MAX, regType, m_func);
                    highOpnd = IR::IntConstOpnd::New(value >> 32, regType, m_func);
                }
                else
                {
                    Assert(UNREACHED);
                }
                retInstr->UnlinkSrc1();
                retInstr->SetSrc1(lowOpnd);

                // Mov high bits to edx
                IR::RegOpnd* regEdx = IR::RegOpnd::New(regType, this->m_func);
                regEdx->SetReg(RegEDX);
                Lowerer::InsertMove(regEdx, highOpnd, retInstr);
                retInstr->SetSrc2(regEdx);
            }
#endif
            break;
        }
        case Js::AsmJsRetType::Void:
            needsRetReg = false;
            break;
        case Js::AsmJsRetType::Signed:
            regType = TyInt32;
            break;
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Float32x4:
            regType = TySimd128F4;
            break;
        case Js::AsmJsRetType::Int32x4:
            regType = TySimd128I4;
            break;
        case Js::AsmJsRetType::Float64x2:
            regType = TySimd128D2;
            break;
        case Js::AsmJsRetType::Int64x2:
            regType = TySimd128I2;
            break;
        case Js::AsmJsRetType::Int16x8:
            regType = TySimd128I8;
            break;
        case Js::AsmJsRetType::Int8x16:
            regType = TySimd128I16;
            break;
        case Js::AsmJsRetType::Uint32x4:
            regType = TySimd128U4;
            break;
        case Js::AsmJsRetType::Uint16x8:
            regType = TySimd128U8;
            break;
        case Js::AsmJsRetType::Uint8x16:
            regType = TySimd128U16;
            break;
        case Js::AsmJsRetType::Bool32x4:
            regType = TySimd128B4;
            break;
        case Js::AsmJsRetType::Bool16x8:
            regType = TySimd128B8;
            break;
        case Js::AsmJsRetType::Bool8x16:
            regType = TySimd128B16;
            break;
#endif
        default:
            Assert(UNREACHED);
        }

        if (needsRetReg)
        {
            retReg = IR::RegOpnd::New(regType, m_func);
            retReg->SetReg(lowererMDArch.GetRegReturnAsmJs(regType));
        }
    }
    else
#endif
    {
        retReg = IR::RegOpnd::New(TyMachReg, m_func);
        retReg->SetReg(lowererMDArch.GetRegReturn(TyMachReg));
    }
    if (needsRetReg)
    {
    Lowerer::InsertMove(retReg, retInstr->UnlinkSrc1(), retInstr);
    retInstr->SetSrc1(retReg);
    }
    return retInstr;
}